

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O0

_Bool do_op2(TCGContext_conflict9 *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a,TCGOpcode opc)

{
  TCGType_conflict type_00;
  int iVar1;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGArg a0;
  TCGArg a_00;
  TCGOpcode *n;
  TCGOpcode *hold_list;
  int can;
  TCGType_conflict type;
  TCGArg ai;
  TCGArg ri;
  TCGTemp *at;
  TCGTemp *rt;
  TCGOpcode opc_local;
  TCGv_vec a_local;
  TCGv_vec r_local;
  uint vece_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  ts = tcgv_vec_temp(tcg_ctx,r);
  ts_00 = tcgv_vec_temp(tcg_ctx,a);
  a0 = temp_arg(ts);
  a_00 = temp_arg(ts_00);
  type_00 = (TCGType_conflict)((ulong)*(undefined8 *)ts >> 0x10) & 0xff;
  tcg_assert_listed_vecop(opc);
  iVar1 = tcg_can_emit_vec_op_tricore(tcg_ctx,opc,type_00,vece);
  if (iVar1 < 1) {
    if (-1 < iVar1) {
      return false;
    }
    n = tcg_swap_vecop_list((TCGOpcode *)0x0);
    tcg_expand_vec_op_tricore(tcg_ctx,opc,type_00,vece,a0,a_00);
    tcg_swap_vecop_list(n);
  }
  else {
    vec_gen_2_tricore(tcg_ctx,opc,type_00,vece,a0,a_00);
  }
  return true;
}

Assistant:

static bool do_op2(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a, TCGOpcode opc)
{
    TCGTemp *rt = tcgv_vec_temp(tcg_ctx, r);
    TCGTemp *at = tcgv_vec_temp(tcg_ctx, a);
    TCGArg ri = temp_arg(rt);
    TCGArg ai = temp_arg(at);
    TCGType type = rt->base_type;
    int can;

    tcg_debug_assert(at->base_type >= type);
    tcg_assert_listed_vecop(opc);
    can = tcg_can_emit_vec_op(tcg_ctx, opc, type, vece);
    if (can > 0) {
        vec_gen_2(tcg_ctx, opc, type, vece, ri, ai);
    } else if (can < 0) {
        const TCGOpcode *hold_list = tcg_swap_vecop_list(NULL);
        tcg_expand_vec_op(tcg_ctx, opc, type, vece, ri, ai);
        tcg_swap_vecop_list(hold_list);
    } else {
        return false;
    }
    return true;
}